

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O2

void __thiscall
cmSearchPath::AddPrefixPaths
          (cmSearchPath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths,char *base)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  cmValue args_1;
  string *__return_storage_ptr__;
  pointer __lhs;
  string subdir;
  string add;
  string dir;
  string prefix;
  cmAlphaNum local_100;
  undefined1 local_d0 [48];
  cmAlphaNum local_a0;
  string local_70;
  string local_50;
  
  if (this->FC == (cmFindCommon *)0x0) {
    __assert_fail("this->FC != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSearchPath.cxx"
                  ,0x9c,
                  "void cmSearchPath::AddPrefixPaths(const std::vector<std::string> &, const char *)"
                 );
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&subdir,"bin",(allocator<char> *)&add);
  bVar3 = std::operator==(&this->FC->CMakePathName,"INCLUDE");
  if ((bVar3) || (bVar3 = std::operator==(&this->FC->CMakePathName,"LIBRARY"), bVar3)) {
    std::__cxx11::string::assign((char *)&subdir);
  }
  else {
    bVar3 = std::operator==(&this->FC->CMakePathName,"FRAMEWORK");
    if (bVar3) {
      subdir._M_string_length = 0;
      *subdir._M_dataplus._M_p = '\0';
    }
  }
  __lhs = (paths->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__lhs == pbVar1) {
      std::__cxx11::string::~string((string *)&subdir);
      return;
    }
    std::__cxx11::string::string((string *)&dir,(string *)__lhs);
    if (((subdir._M_string_length != 0) && (dir._M_string_length != 0)) &&
       (dir._M_dataplus._M_p[dir._M_string_length - 1] != '/')) {
      std::__cxx11::string::append((char *)&dir);
    }
    std::__cxx11::string::string((string *)&prefix,(string *)&dir);
    if ((prefix._M_string_length != 0) && (bVar3 = std::operator!=(&prefix,"/"), bVar3)) {
      std::__cxx11::string::erase((ulong)&prefix,prefix._M_string_length - 1);
    }
    bVar3 = std::operator==(&subdir,"include");
    if ((bVar3) || (bVar3 = std::operator==(&subdir,"lib"), bVar3)) {
      pcVar2 = this->FC->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&add,"CMAKE_LIBRARY_ARCHITECTURE",(allocator<char> *)&local_100);
      args_1 = cmMakefile::GetDefinition(pcVar2,&add);
      std::__cxx11::string::~string((string *)&add);
      if ((args_1.Value != (string *)0x0) && ((args_1.Value)->_M_string_length != 0)) {
        pcVar2 = this->FC->Makefile;
        __return_storage_ptr__ = (string *)local_d0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&add,"CMAKE_SYSROOT",(allocator<char> *)__return_storage_ptr__);
        bVar3 = cmMakefile::IsDefinitionSet(pcVar2,&add);
        if (bVar3) {
          pcVar2 = this->FC->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"CMAKE_PREFIX_LIBRARY_ARCHITECTURE",
                     (allocator<char> *)&local_a0);
          bVar3 = cmMakefile::IsDefinitionSet(pcVar2,(string *)&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&add);
          if (!bVar3) goto LAB_002c8222;
          add._M_dataplus._M_p = (pointer)0x1;
          add._M_string_length = (size_type)&add.field_2;
          add.field_2._M_local_buf[0] = '/';
          local_100.View_._M_str = ((args_1.Value)->_M_dataplus)._M_p;
          local_100.View_._M_len = (args_1.Value)->_M_string_length;
          cmStrCat<std::__cxx11::string,std::__cxx11::string>
                    (&local_70,(cmAlphaNum *)&add,&local_100,&dir,&subdir);
          local_d0._0_8_ = (pointer)0x1;
          local_d0._8_8_ = local_d0 + 0x10;
          local_d0[0x10] = '/';
          local_a0.View_._M_str = ((args_1.Value)->_M_dataplus)._M_p;
          local_a0.View_._M_len = (args_1.Value)->_M_string_length;
          cmStrCat<std::__cxx11::string>(&local_50,(cmAlphaNum *)local_d0,&local_a0,&prefix);
          __return_storage_ptr__ = &local_70;
          AddPathInternal(this,__return_storage_ptr__,&local_50,base);
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          std::__cxx11::string::~string((string *)&add);
LAB_002c8222:
          add._M_dataplus._M_p = (pointer)dir._M_string_length;
          add._M_string_length = (size_type)dir._M_dataplus._M_p;
          local_100.View_._M_len = subdir._M_string_length;
          local_100.View_._M_str = subdir._M_dataplus._M_p;
          local_a0.View_._M_len = CONCAT71(local_a0.View_._M_len._1_7_,0x2f);
          cmStrCat<char,std::__cxx11::string>
                    (__return_storage_ptr__,(cmAlphaNum *)&add,&local_100,(char *)&local_a0,
                     args_1.Value);
          AddPathInternal(this,__return_storage_ptr__,&prefix,base);
        }
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
    }
    std::operator+(&add,&dir,&subdir);
    bVar3 = std::operator!=(&add,"/");
    if (bVar3) {
      AddPathInternal(this,&add,&prefix,base);
    }
    bVar3 = std::operator==(&subdir,"bin");
    if (bVar3) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100
                     ,&dir,"sbin");
      AddPathInternal(this,(string *)&local_100,&prefix,base);
      std::__cxx11::string::~string((string *)&local_100);
    }
    if ((subdir._M_string_length != 0) && (bVar3 = std::operator!=(__lhs,"/"), bVar3)) {
      AddPathInternal(this,__lhs,&prefix,base);
    }
    std::__cxx11::string::~string((string *)&add);
    std::__cxx11::string::~string((string *)&prefix);
    std::__cxx11::string::~string((string *)&dir);
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

void cmSearchPath::AddPrefixPaths(const std::vector<std::string>& paths,
                                  const char* base)
{
  assert(this->FC != nullptr);

  // default for programs
  std::string subdir = "bin";

  if (this->FC->CMakePathName == "INCLUDE") {
    subdir = "include";
  } else if (this->FC->CMakePathName == "LIBRARY") {
    subdir = "lib";
  } else if (this->FC->CMakePathName == "FRAMEWORK") {
    subdir.clear(); // ? what to do for frameworks ?
  }

  for (std::string const& path : paths) {
    std::string dir = path;
    if (!subdir.empty() && !dir.empty() && dir.back() != '/') {
      dir += "/";
    }
    std::string prefix = dir;
    if (!prefix.empty() && prefix != "/") {
      prefix.erase(prefix.size() - 1);
    }
    if (subdir == "include" || subdir == "lib") {
      cmValue arch =
        this->FC->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE");
      if (cmNonempty(arch)) {
        if (this->FC->Makefile->IsDefinitionSet("CMAKE_SYSROOT") &&
            this->FC->Makefile->IsDefinitionSet(
              "CMAKE_PREFIX_LIBRARY_ARCHITECTURE")) {
          this->AddPathInternal(cmStrCat('/', *arch, dir, subdir),
                                cmStrCat('/', *arch, prefix), base);
        } else {
          this->AddPathInternal(cmStrCat(dir, subdir, '/', *arch), prefix,
                                base);
        }
      }
    }
    std::string add = dir + subdir;
    if (add != "/") {
      this->AddPathInternal(add, prefix, base);
    }
    if (subdir == "bin") {
      this->AddPathInternal(dir + "sbin", prefix, base);
    }
    if (!subdir.empty() && path != "/") {
      this->AddPathInternal(path, prefix, base);
    }
  }
}